

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O0

void * mslab_alloc(mempool *pool,mslab *slab)

{
  uint32_t uVar1;
  mslab *pmVar2;
  void *local_20;
  void *result;
  mslab *slab_local;
  mempool *pool_local;
  
  if (slab->nfree != 0) {
    if (slab->free_list == (void *)0x0) {
      local_20 = (void *)((long)&(slab->slab).next_in_cache.prev + (ulong)slab->free_offset);
      slab->free_offset = pool->objsize + slab->free_offset;
    }
    else {
      local_20 = slab->free_list;
      slab->free_list = *slab->free_list;
    }
    uVar1 = slab->nfree - 1;
    slab->nfree = uVar1;
    if (uVar1 == 0) {
      if (slab == pool->first_hot_slab) {
        pmVar2 = mslab_tree_next(&pool->hot_slabs,slab);
        pool->first_hot_slab = pmVar2;
      }
      mslab_tree_remove(&pool->hot_slabs,slab);
      slab->in_hot_slabs = false;
    }
    return local_20;
  }
  __assert_fail("slab->nfree",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/mempool.c"
                ,0x44,"void *mslab_alloc(struct mempool *, struct mslab *)");
}

Assistant:

void *
mslab_alloc(struct mempool *pool, struct mslab *slab)
{
	assert(slab->nfree);
	void *result;
	if (slab->free_list) {
		/* Recycle an object from the garbage pool. */
		result = slab->free_list;
		/*
		 * In case when pool objsize is not aligned sizeof(intptr_t)
		 * boundary we can't use *(void **)slab->free_list construction,
		 * because (void **)slab->free_list has not necessary aligment.
		 * memcpy can work with misaligned address.
		 */
		memcpy(&slab->free_list, slab->free_list, sizeof(void *));
	} else {
		/* Use an object from the "untouched" area of the slab. */
		result = (char *)slab + slab->free_offset;
		slab->free_offset += pool->objsize;
	}

	/* If the slab is full, remove it from the rb tree. */
	if (--slab->nfree == 0) {
		if (slab == pool->first_hot_slab) {
			pool->first_hot_slab = mslab_tree_next(&pool->hot_slabs,
							       slab);
		}
		mslab_tree_remove(&pool->hot_slabs, slab);
		slab->in_hot_slabs = false;
	}
	return result;
}